

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::ssbo::SSBOLayoutCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,SSBOLayoutCaseInstance *this)

{
  undefined1 *this_00;
  pointer *this_01;
  uint size_;
  VkDescriptorSet destSet;
  VkCommandBuffer_s *pVVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)8>_> data_04;
  bool bVar2;
  deUint32 queueFamilyIndex_00;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  VkResult VVar6;
  DeviceInterface *vkd;
  VkDevice device_00;
  VkQueue pVVar7;
  Handle<(vk::HandleType)8> *pHVar8;
  Allocation *pAVar9;
  void *pvVar10;
  VkDeviceMemory VVar11;
  VkDeviceSize VVar12;
  Handle<(vk::HandleType)21> *pHVar13;
  Handle<(vk::HandleType)22> *pHVar14;
  uint *puVar15;
  reference pvVar16;
  reference pvVar17;
  reference ppvVar18;
  Unique<vk::Handle<(vk::HandleType)8>_> *pUVar19;
  InstanceInterface *pIVar20;
  VkPhysicalDevice pVVar21;
  size_type sVar22;
  const_reference pvVar23;
  reference pvVar24;
  ProgramCollection<vk::ProgramBinary> *this_02;
  ProgramBinary *binary;
  Handle<(vk::HandleType)14> *pHVar25;
  Handle<(vk::HandleType)16> *pHVar26;
  Handle<(vk::HandleType)24> *pHVar27;
  VkCommandBuffer_s **ppVVar28;
  Handle<(vk::HandleType)18> *pHVar29;
  Handle<(vk::HandleType)6> *pHVar30;
  int *piVar31;
  TestContext *pTVar32;
  TestLog *pTVar33;
  MessageBuilder *pMVar34;
  Context *pCVar35;
  undefined8 in_stack_ffffffffffffeff8;
  undefined4 in_stack_fffffffffffff000;
  undefined4 in_stack_fffffffffffff004;
  deUint32 local_e44;
  allocator<char> local_d21;
  string local_d20;
  allocator<char> local_cf9;
  string local_cf8;
  allocator<char> local_cd1;
  string local_cd0;
  undefined4 local_cb0;
  allocator<char> local_ca9;
  string local_ca8;
  undefined1 local_c81;
  undefined1 local_c80 [7];
  bool compareOk;
  int local_afc [2];
  int resCount;
  int refCount;
  bool counterOk;
  undefined8 uStack_ae8;
  VkSubmitInfo submitInfo;
  undefined1 local_a98 [8];
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  undefined8 uStack_a68;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  undefined1 local_a40 [8];
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined1 local_9f8 [8];
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkComputePipelineCreateInfo pipelineCreateInfo;
  VkPipelineShaderStageCreateInfo pipelineShaderStageParams;
  string local_940;
  undefined1 local_920 [8];
  Move<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  Allocation *alloc_3;
  size_t bufferNdx;
  int totalSize;
  Allocation *alloc_2;
  ulong uStack_878;
  int size;
  size_t allocNdx;
  Location local_858;
  VkDescriptorSet local_850;
  deUint32 local_844;
  BufferBlock *pBStack_840;
  int numBlocksInBinding;
  BufferBlock *block_1;
  int bindingNdx_1;
  int blockNdx_3;
  RefData<vk::Handle<(vk::HandleType)8>_> local_820;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> local_800;
  deUint64 local_7f0;
  VkDescriptorBufferInfo local_7e8;
  uint local_7cc;
  uint local_7c8;
  deUint32 offset;
  deUint32 bufferSize_2;
  int blockNdx_2;
  deUint32 local_7b4;
  deUint64 local_7b0;
  undefined1 local_7a8 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc_1;
  Move<vk::Handle<(vk::HandleType)8>_> buffer_1;
  int totalBufferSize;
  int local_76c;
  int local_764;
  int bufferSize_1;
  int blockNdx_1;
  int curOffset;
  int bindingAlignment;
  VkPhysicalDeviceProperties properties;
  RefData<vk::Handle<(vk::HandleType)8>_> local_410;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> local_3f0;
  deUint64 local_3e0;
  VkDescriptorBufferInfo local_3d8;
  deUint32 local_3bc;
  deUint64 local_3b8;
  undefined1 local_3b0 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  int local_378;
  int local_370;
  deUint32 bufferSize;
  int blockNdx;
  vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
  blockLocations;
  vector<void_*,_std::allocator<void_*>_> mapPtrs;
  vector<int,_std::allocator<int>_> bufferSizes;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> mappedBlockPtrs;
  allocator<vk::VkDescriptorBufferInfo> local_2f1;
  undefined1 local_2f0 [8];
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptors;
  DescriptorSetUpdateBuilder setUpdateBuilder;
  undefined1 local_288 [8];
  VkDescriptorBufferInfo descriptorInfo;
  RefData<vk::Handle<(vk::HandleType)22>_> local_250;
  undefined1 local_230 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  VkDescriptorSetAllocateInfo allocInfo;
  RefData<vk::Handle<(vk::HandleType)21>_> local_1c8;
  undefined1 local_1a8 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  RefData<vk::Handle<(vk::HandleType)19>_> local_168;
  undefined1 local_148 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  BufferBlock *block;
  int bindingNdx;
  int numBindings;
  int numBlocks;
  DescriptorPoolBuilder poolBuilder;
  DescriptorSetLayoutBuilder setLayoutBuilder;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_88;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_78;
  undefined1 local_68 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> acBufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> acBuffer;
  deUint32 acBufferSize;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  SSBOLayoutCaseInstance *this_local;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar7 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  this_00 = &acBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
             m_data.field_0x8;
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)this_00,(this->super_TestInstance).m_context,
               0x400,0x20);
  pCVar35 = (this->super_TestInstance).m_context;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this_00);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_88,pCVar35,
             (VkBuffer)pHVar8->m_internal,::vk::MemoryRequirement::HostVisible);
  local_78 = de::details::MovePtr::operator_cast_to_PtrData(&local_88,(MovePtr *)pCVar35);
  data._8_4_ = in_stack_fffffffffffff000;
  data.ptr = (Allocation *)in_stack_ffffffffffffeff8;
  data._12_4_ = in_stack_fffffffffffff004;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_88);
  pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68);
  pvVar10 = ::vk::Allocation::getHostPtr(pAVar9);
  ::deMemset(pvVar10,0,0x400);
  pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68);
  VVar11 = ::vk::Allocation::getMemory(pAVar9);
  pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68);
  VVar12 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::flushMappedMemoryRange(vkd,device_00,VVar11,VVar12,0x400);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &poolBuilder.m_counts.
              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&numBindings);
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)
             &poolBuilder.m_counts.
              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
             0x20);
  bindingNdx = 0;
  iVar3 = ShaderInterface::getNumBlocks(this->m_interface);
  for (block._4_4_ = 0; block._4_4_ < iVar3; block._4_4_ = block._4_4_ + 1) {
    descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)ShaderInterface::getBlock(this->m_interface,block._4_4_);
    bVar2 = BufferBlock::isArray
                      ((BufferBlock *)
                       descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                       deleter.m_allocator);
    if (bVar2) {
      dVar4 = BufferBlock::getArraySize
                        ((BufferBlock *)
                         descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                         deleter.m_allocator);
      ::vk::DescriptorSetLayoutBuilder::addArrayBinding
                ((DescriptorSetLayoutBuilder *)
                 &poolBuilder.m_counts.
                  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,dVar4,0x20);
      iVar5 = BufferBlock::getArraySize
                        ((BufferBlock *)
                         descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                         deleter.m_allocator);
      bindingNdx = iVar5 + bindingNdx;
    }
    else {
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                ((DescriptorSetLayoutBuilder *)
                 &poolBuilder.m_counts.
                  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
      bindingNdx = bindingNdx + 1;
    }
  }
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)&numBindings,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,bindingNdx + 1)
  ;
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator,
             (DescriptorSetLayoutBuilder *)
             &poolBuilder.m_counts.
              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,vkd,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_168,
             (Move *)&descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_168.deleter.m_deviceIface;
  data_00.object.m_internal = local_168.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_168.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_168.deleter.m_device;
  data_00.deleter.m_allocator = local_168.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_148,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocInfo.pSetLayouts,
             (DescriptorPoolBuilder *)&numBindings,vkd,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&allocInfo.pSetLayouts);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1c8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1c8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1c8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_1c8.deleter.m_device;
  data_01.deleter.m_allocator = local_1c8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_1a8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocInfo.pSetLayouts);
  descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal.
  _0_4_ = 0x22;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_1a8);
  allocInfo.pNext = (void *)pHVar13->m_internal;
  allocInfo.descriptorPool.m_internal._0_4_ = 1;
  allocInfo._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_148);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorInfo.range,vkd,device_00,
             (VkDescriptorSetAllocateInfo *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_250,(Move *)&descriptorInfo.range);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_250.deleter.m_deviceIface;
  data_02.object.m_internal = local_250.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_250.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_250.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_250.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_230,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorInfo.range);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      &acBufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                       field_0x8);
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_288,(VkBuffer)pHVar8->m_internal,0,0x400);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)
             &descriptors.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<vk::VkDescriptorBufferInfo>::allocator(&local_2f1);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_2f0,(long)bindingNdx,&local_2f1);
  std::allocator<vk::VkDescriptorBufferInfo>::~allocator(&local_2f1);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_230);
  destSet.m_internal = pHVar14->m_internal;
  mappedBlockPtrs.
  super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  ::vk::DescriptorSetUpdateBuilder::writeSingle
            ((DescriptorSetUpdateBuilder *)
             &descriptors.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,destSet,
             (Location *)
             &mappedBlockPtrs.
              super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
             (VkDescriptorBufferInfo *)local_288);
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::vector
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
             &bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown_15::computeBufferSizes
            ((vector<int,_std::allocator<int>_> *)
             &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this->m_interface,this->m_refLayout);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &blockLocations.
              super__Vector_base<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>::allocator
            ((allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation> *)((long)&bufferSize + 3));
  std::
  vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
  ::vector((vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
            *)&blockNdx,(long)bindingNdx,
           (allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation> *)((long)&bufferSize + 3));
  std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>::~allocator
            ((allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation> *)((long)&bufferSize + 3));
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    std::vector<void_*,_std::allocator<void_*>_>::resize
              ((vector<void_*,_std::allocator<void_*>_> *)
               &blockLocations.
                super__Vector_base<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)bindingNdx);
    for (local_370 = 0; local_370 < bindingNdx; local_370 = local_370 + 1) {
      puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)local_370);
      size_ = *puVar15;
      anon_unknown_15::BlockLocation::BlockLocation
                ((BlockLocation *)
                 &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator,
                 local_370,0,size_);
      pvVar16 = std::
                vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                ::operator[]((vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                              *)&blockNdx,(long)local_370);
      pvVar16->size = local_378;
      *(VkAllocationCallbacks **)pvVar16 =
           buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
      createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                   &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                    m_data.field_0x8,(this->super_TestInstance).m_context,(ulong)size_,0x20);
      pCVar35 = (this->super_TestInstance).m_context;
      pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                          &alloc.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.field_0x8);
      local_3b8 = pHVar8->m_internal;
      local_3bc = ::vk::MemoryRequirement::HostVisible.m_flags;
      allocateAndBindMemory
                ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3b0,pCVar35,
                 (VkBuffer)local_3b8,::vk::MemoryRequirement::HostVisible);
      pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                          &alloc.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.field_0x8);
      local_3e0 = pHVar8->m_internal;
      ::vk::makeDescriptorBufferInfo(&local_3d8,(VkBuffer)local_3e0,0,(ulong)size_);
      pvVar17 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ::operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_2f0,(long)local_370);
      pvVar17->range = local_3d8.range;
      (pvVar17->buffer).m_internal = local_3d8.buffer.m_internal;
      pvVar17->offset = local_3d8.offset;
      pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
               operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                          local_3b0);
      pvVar10 = ::vk::Allocation::getHostPtr(pAVar9);
      ppvVar18 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                           ((vector<void_*,_std::allocator<void_*>_> *)
                            &blockLocations.
                             super__Vector_base<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_370);
      *ppvVar18 = pvVar10;
      pUVar19 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
      ::vk::refdetails::Move::operator_cast_to_RefData
                (&local_410,
                 (Move *)&alloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.field_0x8);
      data_03.deleter.m_deviceIface._0_4_ = (int)local_410.deleter.m_deviceIface;
      data_03.object.m_internal = local_410.object.m_internal;
      data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_410.deleter.m_deviceIface >> 0x20);
      data_03.deleter.m_device = local_410.deleter.m_device;
      data_03.deleter.m_allocator = local_410.deleter.m_allocator;
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(pUVar19,data_03);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
                (&local_3f0,pUVar19);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
      ::push_back(&this->m_uniformBuffers,&local_3f0);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&local_3f0)
      ;
      pAVar9 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                         ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3b0)
      ;
      de::SharedPtr<vk::Allocation>::SharedPtr
                ((SharedPtr<vk::Allocation> *)
                 &properties.sparseProperties.residencyNonResidentStrict,pAVar9);
      std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
      push_back(&this->m_uniformAllocs,
                (value_type *)&properties.sparseProperties.residencyNonResidentStrict);
      de::SharedPtr<vk::Allocation>::~SharedPtr
                ((SharedPtr<vk::Allocation> *)
                 &properties.sparseProperties.residencyNonResidentStrict);
      de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
                ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3b0);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)8>_> *)
                 &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                  .field_0x8);
    }
  }
  else {
    pIVar20 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar21 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    (*pIVar20->_vptr_InstanceInterface[5])(pIVar20,pVVar21,&curOffset);
    bufferSize_1 = 0;
    for (local_764 = 0; local_764 < bindingNdx; local_764 = local_764 + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_764);
      iVar5 = *pvVar23;
      if (0 < (int)properties.limits.minUniformBufferOffsetAlignment) {
        bufferSize_1 = anon_unknown_15::deRoundUp32
                                 (bufferSize_1,
                                  (int)properties.limits.minUniformBufferOffsetAlignment);
      }
      anon_unknown_15::BlockLocation::BlockLocation
                ((BlockLocation *)
                 ((long)&buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                         m_allocator + 4),0,bufferSize_1,iVar5);
      pvVar16 = std::
                vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                ::operator[]((vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                              *)&blockNdx,(long)local_764);
      pvVar16->index =
           buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._4_4_;
      pvVar16->offset = totalBufferSize;
      pvVar16->size = local_76c;
      bufferSize_1 = iVar5 + bufferSize_1;
    }
    buffer_1.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ =
         bufferSize_1;
    createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                 &alloc_1.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                  m_data.field_0x8,(this->super_TestInstance).m_context,(long)bufferSize_1,0x20);
    pCVar35 = (this->super_TestInstance).m_context;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                        &alloc_1.
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                         m_data.field_0x8);
    local_7b0 = pHVar8->m_internal;
    local_7b4 = ::vk::MemoryRequirement::HostVisible.m_flags;
    allocateAndBindMemory
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_7a8,pCVar35,
               (VkBuffer)local_7b0,::vk::MemoryRequirement::HostVisible);
    pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_7a8
                       );
    _bufferSize_2 = ::vk::Allocation::getHostPtr(pAVar9);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)
               &blockLocations.
                super__Vector_base<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&bufferSize_2);
    for (offset = 0; (int)offset < bindingNdx; offset = offset + 1) {
      puVar15 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)
                                   &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)(int)offset);
      local_7c8 = *puVar15;
      pvVar16 = std::
                vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                ::operator[]((vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
                              *)&blockNdx,(long)(int)offset);
      local_7cc = pvVar16->offset;
      pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                          &alloc_1.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.field_0x8);
      local_7f0 = pHVar8->m_internal;
      ::vk::makeDescriptorBufferInfo
                (&local_7e8,(VkBuffer)local_7f0,(ulong)local_7cc,(ulong)local_7c8);
      pvVar17 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ::operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                              *)local_2f0,(long)(int)offset);
      (pvVar17->buffer).m_internal = local_7e8.buffer.m_internal;
      pvVar17->offset = local_7e8.offset;
      pvVar17->range = local_7e8.range;
    }
    pUVar19 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_820,
               (Move *)&alloc_1.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_820.deleter.m_deviceIface;
    data_04.object.m_internal = local_820.object.m_internal;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_820.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device = local_820.deleter.m_device;
    data_04.deleter.m_allocator = local_820.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(pUVar19,data_04);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
              (&local_800,pUVar19);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>_>_>
    ::push_back(&this->m_uniformBuffers,&local_800);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&local_800);
    pAVar9 = de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::release
                       ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_7a8);
    de::SharedPtr<vk::Allocation>::SharedPtr((SharedPtr<vk::Allocation> *)&bindingNdx_1,pAVar9);
    std::vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
    push_back(&this->m_uniformAllocs,(value_type *)&bindingNdx_1);
    de::SharedPtr<vk::Allocation>::~SharedPtr((SharedPtr<vk::Allocation> *)&bindingNdx_1);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_7a8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &alloc_1.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                .field_0x8);
  }
  block_1._4_4_ = 0;
  for (block_1._0_4_ = 0; (int)block_1 < iVar3; block_1._0_4_ = (int)block_1 + 1) {
    pBStack_840 = ShaderInterface::getBlock(this->m_interface,(int)block_1);
    bVar2 = BufferBlock::isArray(pBStack_840);
    if (bVar2) {
      local_e44 = BufferBlock::getArraySize(pBStack_840);
    }
    else {
      local_e44 = 1;
    }
    local_844 = local_e44;
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_230);
    local_850.m_internal = pHVar14->m_internal;
    local_858 = ::vk::DescriptorSetUpdateBuilder::Location::binding((int)block_1 + 1);
    dVar4 = local_844;
    pvVar17 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
              operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          *)local_2f0,(long)block_1._4_4_);
    ::vk::DescriptorSetUpdateBuilder::writeArray
              ((DescriptorSetUpdateBuilder *)
               &descriptors.
                super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_850,&local_858,
               VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,dVar4,pvVar17);
    block_1._4_4_ = local_844 + block_1._4_4_;
  }
  anon_unknown_15::blockLocationsToPtrs
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)&allocNdx,
             this->m_refLayout,
             (vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
              *)&blockNdx,
             (vector<void_*,_std::allocator<void_*>_> *)
             &blockLocations.
              super__Vector_base<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_01 = &bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::operator=
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)this_01,
             (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)&allocNdx)
  ;
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::~vector
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)&allocNdx)
  ;
  anon_unknown_15::copyData
            (this->m_refLayout,
             (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)this_01,
             this->m_refLayout,&this->m_initialData->pointers);
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    for (uStack_878 = 0;
        sVar22 = std::
                 vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                 ::size(&this->m_uniformAllocs), uStack_878 < sVar22; uStack_878 = uStack_878 + 1) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,uStack_878);
      iVar3 = *pvVar23;
      pvVar24 = std::
                vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                ::operator[](&this->m_uniformAllocs,uStack_878);
      pAVar9 = de::SharedPtr<vk::Allocation>::get(pvVar24);
      VVar11 = ::vk::Allocation::getMemory(pAVar9);
      VVar12 = ::vk::Allocation::getOffset(pAVar9);
      ::vk::flushMappedMemoryRange(vkd,device_00,VVar11,VVar12,(long)iVar3);
    }
  }
  else {
    bufferNdx._4_4_ = 0;
    for (alloc_3 = (Allocation *)0x0;
        pAVar9 = (Allocation *)
                 std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)
                            &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage), alloc_3 < pAVar9;
        alloc_3 = (Allocation *)((long)&alloc_3->_vptr_Allocation + 1)) {
      pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(size_type)alloc_3);
      bufferNdx._4_4_ = *pvVar23 + bufferNdx._4_4_;
    }
    pvVar24 = std::
              vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              ::operator[](&this->m_uniformAllocs,0);
    pAVar9 = de::SharedPtr<vk::Allocation>::get(pvVar24);
    VVar11 = ::vk::Allocation::getMemory(pAVar9);
    VVar12 = ::vk::Allocation::getOffset(pAVar9);
    ::vk::flushMappedMemoryRange(vkd,device_00,VVar11,VVar12,(long)bufferNdx._4_4_);
  }
  std::
  vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
  ::~vector((vector<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
             *)&blockNdx);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &blockLocations.
              super__Vector_base<vkt::ssbo::(anonymous_namespace)::BlockLocation,_std::allocator<vkt::ssbo::(anonymous_namespace)::BlockLocation>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::vk::DescriptorSetUpdateBuilder::update
            ((DescriptorSetUpdateBuilder *)
             &descriptors.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,vkd,device_00);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator._0_4_ =
       0x1e;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_148);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
             ,vkd,device_00,
             (VkPipelineLayoutCreateInfo *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator,(VkAllocationCallbacks *)0x0);
  this_02 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"compute",
             (allocator<char> *)((long)&pipelineShaderStageParams.pSpecializationInfo + 7));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_02,&local_940);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_920,vkd,device_00,binary,0);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&pipelineShaderStageParams.pSpecializationInfo + 7));
  pipelineCreateInfo.basePipelineIndex = 0x12;
  pipelineShaderStageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineShaderStageParams._4_4_ = 0;
  pipelineShaderStageParams.pNext._0_4_ = 0;
  pipelineShaderStageParams.pNext._4_4_ = 0x20;
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_920);
  pipelineCreateInfo.stage._16_8_ = pHVar25->m_internal;
  pipelineShaderStageParams.module.m_internal = (long)"pre_main" + 4;
  pipelineShaderStageParams.pName = (char *)0x0;
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._0_4_ = 0x1d;
  pipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCreateInfo._4_4_ = 0;
  pipelineCreateInfo.pNext._0_4_ = 0;
  pipelineCreateInfo._20_4_ = pipelineCreateInfo._92_4_;
  pipelineCreateInfo.flags = pipelineCreateInfo.basePipelineIndex;
  pipelineCreateInfo.stage.pNext =
       (void *)CONCAT44(pipelineShaderStageParams.pNext._4_4_,pipelineShaderStageParams.pNext._0_4_)
  ;
  pipelineCreateInfo.stage.module.m_internal = (long)"pre_main" + 4;
  pipelineCreateInfo.stage.pName = (char *)0x0;
  pipelineCreateInfo.stage.sType = pipelineShaderStageParams.sType;
  pipelineCreateInfo.stage._4_4_ = pipelineShaderStageParams._4_4_;
  pipelineShaderStageParams._16_8_ = pipelineCreateInfo.stage._16_8_;
  pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator);
  pipelineCreateInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pHVar26->m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&pipelineCreateInfo.layout,0);
  pipelineCreateInfo.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle
            ((Handle<(vk::HandleType)15> *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0);
  ::vk::createComputePipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_9f8,vkd,device_00,
             (VkPipelineCache)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkComputePipelineCreateInfo *)
             &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vkd,device_00,2
             ,queueFamilyIndex_00,(VkAllocationCallbacks *)0x0);
  pHVar27 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                       &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  cmdBufBeginParams.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)pHVar27->m_internal;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_a40,vkd,device_00,
             (VkCommandPool)cmdBufBeginParams.pInheritanceInfo,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  cmdBufBeginParams.pNext = (void *)0x0;
  cmdBufBeginParams.flags = 0;
  cmdBufBeginParams._20_4_ = 0;
  uStack_a68 = 0x2a;
  cmdBufBeginParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufBeginParams._4_4_ = 0;
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_a40);
  VVar6 = (*vkd->_vptr_DeviceInterface[0x49])(vkd,*ppVVar28,&uStack_a68);
  ::vk::checkResult(VVar6,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x844);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_a40);
  pVVar1 = *ppVVar28;
  pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_9f8);
  (*vkd->_vptr_DeviceInterface[0x4c])(vkd,pVVar1,1,pHVar29->m_internal);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_a40);
  pVVar1 = *ppVVar28;
  pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar26->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_230);
  (*vkd->_vptr_DeviceInterface[0x56])
            (vkd,pVVar1,1,
             fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,0,1,
             pHVar14,0,0);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_a40);
  (*vkd->_vptr_DeviceInterface[0x5d])(vkd,*ppVVar28,1,1);
  ppVVar28 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_a40);
  VVar6 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,*ppVVar28);
  ::vk::checkResult(VVar6,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x84b);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_a98,vkd,device_00,0,
                    (VkAllocationCallbacks *)0x0);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_ae8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_a40);
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_a98);
  _refCount = pHVar30->m_internal;
  VVar6 = (*vkd->_vptr_DeviceInterface[2])(vkd,pVVar7,1,&uStack_ae8,_refCount);
  ::vk::checkResult(VVar6,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85c);
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_a98);
  VVar6 = (*vkd->_vptr_DeviceInterface[0x16])(vkd,device_00,1,pHVar30,1,0xffffffffffffffff);
  ::vk::checkResult(VVar6,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85d);
  local_afc[1] = 1;
  local_afc[0] = 0;
  pAVar9 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68);
  piVar31 = (int *)::vk::Allocation::getHostPtr(pAVar9);
  local_afc[0] = *piVar31;
  resCount._3_1_ = local_afc[0] == 1;
  if (!(bool)resCount._3_1_) {
    pTVar32 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar33 = tcu::TestContext::getLog(pTVar32);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_c80,pTVar33,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar34 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_c80,(char (*) [23])"Error: ac_numPassed = ");
    pMVar34 = tcu::MessageBuilder::operator<<(pMVar34,local_afc);
    pMVar34 = tcu::MessageBuilder::operator<<(pMVar34,(char (*) [12])0x1367f41);
    pMVar34 = tcu::MessageBuilder::operator<<(pMVar34,local_afc + 1);
    tcu::MessageBuilder::operator<<(pMVar34,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_c80);
  }
  pTVar32 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar33 = tcu::TestContext::getLog(pTVar32);
  local_c81 = anon_unknown_15::compareData
                        (pTVar33,this->m_refLayout,&this->m_writeData->pointers,this->m_refLayout,
                         (vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                          *)&bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  if (((bool)local_c81) && ((resCount._3_1_ & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca8,"Result comparison and counter values are OK",&local_ca9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_ca8);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::allocator<char>::~allocator(&local_ca9);
  }
  else if (((bool)local_c81) || ((resCount._3_1_ & 1) == 0)) {
    if (((bool)local_c81) && ((resCount._3_1_ & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cf8,"Counter value incorrect",&local_cf9);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_cf8);
      std::__cxx11::string::~string((string *)&local_cf8);
      std::allocator<char>::~allocator(&local_cf9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d20,"Result comparison and counter values are incorrect",
                 &local_d21);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_d20);
      std::__cxx11::string::~string((string *)&local_d20);
      std::allocator<char>::~allocator(&local_d21);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd0,"Result comparison failed",&local_cd1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_cd0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::allocator<char>::~allocator(&local_cd1);
  }
  local_cb0 = 1;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)local_a98);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move((Move<vk::VkCommandBuffer_s_*> *)local_a40)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_9f8);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_920);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
            );
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::~vector
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)
             &bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::~vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_2f0);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)
             &descriptors.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_230);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_1a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_148);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder((DescriptorPoolBuilder *)&numBindings);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &poolBuilder.m_counts.
              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_68);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &acBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SSBOLayoutCaseInstance::iterate (void)
{
	// todo: add compute stage availability check
	const vk::DeviceInterface&	vk					= m_context.getDeviceInterface();
	const vk::VkDevice			device				= m_context.getDevice();
	const vk::VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Create descriptor set
	const deUint32 acBufferSize = 1024;
	vk::Move<vk::VkBuffer> acBuffer (createBuffer(m_context, acBufferSize, vk:: VK_BUFFER_USAGE_STORAGE_BUFFER_BIT));
	de::UniquePtr<vk::Allocation> acBufferAlloc (allocateAndBindMemory(m_context, *acBuffer, vk::MemoryRequirement::HostVisible));

	deMemset(acBufferAlloc->getHostPtr(), 0, acBufferSize);
	flushMappedMemoryRange(vk, device, acBufferAlloc->getMemory(), acBufferAlloc->getOffset(), acBufferSize);

	vk::DescriptorSetLayoutBuilder setLayoutBuilder;
	vk::DescriptorPoolBuilder poolBuilder;

	setLayoutBuilder
		.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);

	int numBlocks = 0;
	const int numBindings = m_interface.getNumBlocks();
	for (int bindingNdx = 0; bindingNdx < numBindings; bindingNdx++)
	{
		const BufferBlock& block = m_interface.getBlock(bindingNdx);
		if (block.isArray())
		{
			setLayoutBuilder
				.addArrayBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, block.getArraySize(), vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += block.getArraySize();
		}
		else
		{
			setLayoutBuilder
				.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += 1;
		}
	}

	poolBuilder
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)(1 + numBlocks));

	const vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(setLayoutBuilder.build(vk, device));
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(poolBuilder.build(vk, device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const vk::VkDescriptorSetAllocateInfo allocInfo =
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		*descriptorPool,
		1u,
		&descriptorSetLayout.get(),
	};

	const vk::Unique<vk::VkDescriptorSet> descriptorSet(allocateDescriptorSet(vk, device, &allocInfo));
	const vk::VkDescriptorBufferInfo descriptorInfo = makeDescriptorBufferInfo(*acBuffer, 0ull, acBufferSize);

	vk::DescriptorSetUpdateBuilder setUpdateBuilder;
	std::vector<vk::VkDescriptorBufferInfo>	descriptors(numBlocks);

	setUpdateBuilder
		.writeSingle(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo);

	vector<BlockDataPtr>  mappedBlockPtrs;

	// Upload base buffers
	{
		const std::vector<int>			bufferSizes		= computeBufferSizes(m_interface, m_refLayout);
		std::vector<void*>				mapPtrs;
		std::vector<BlockLocation>		blockLocations	(numBlocks);

		DE_ASSERT(bufferSizes.size() == m_refLayout.blocks.size());

		if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
		{
			mapPtrs.resize(numBlocks);
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				blockLocations[blockNdx] = BlockLocation(blockNdx, 0, bufferSize);

				vk::Move<vk::VkBuffer>				buffer		= createBuffer(m_context, bufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
				de::MovePtr<vk::Allocation>			alloc		= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, 0ull, bufferSize);

				mapPtrs[blockNdx] = alloc->getHostPtr();

				m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
				m_uniformAllocs.push_back(AllocationSp(alloc.release()));
			}
		}
		else
		{
			DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);

			vk::VkPhysicalDeviceProperties properties;
			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &properties);
			const int	bindingAlignment	= (int)properties.limits.minStorageBufferOffsetAlignment;
			int			curOffset			= 0;
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				if (bindingAlignment > 0)
					curOffset = deRoundUp32(curOffset, bindingAlignment);

				blockLocations[blockNdx] = BlockLocation(0, curOffset, bufferSize);
				curOffset += bufferSize;
			}

			const int						totalBufferSize = curOffset;
			vk::Move<vk::VkBuffer>			buffer			= createBuffer(m_context, totalBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
			de::MovePtr<vk::Allocation>		alloc			= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

			mapPtrs.push_back(alloc->getHostPtr());

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32						bufferSize	= bufferSizes[blockNdx];
				const deUint32						offset		= blockLocations[blockNdx].offset;

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, offset, bufferSize);
			}

			m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
			m_uniformAllocs.push_back(AllocationSp(alloc.release()));
		}

		// Update remaining bindings
		{
			int blockNdx = 0;
			for (int bindingNdx = 0; bindingNdx < numBindings; ++bindingNdx)
			{
				const BufferBlock&	block				= m_interface.getBlock(bindingNdx);
				const int			numBlocksInBinding	= (block.isArray() ? block.getArraySize() : 1);

				setUpdateBuilder.writeArray(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(bindingNdx + 1),
					vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, numBlocksInBinding, &descriptors[blockNdx]);

				blockNdx += numBlocksInBinding;
			}
		}

		// Copy the initial data to the storage buffers
		{
			mappedBlockPtrs = blockLocationsToPtrs(m_refLayout, blockLocations, mapPtrs);
			copyData(m_refLayout, mappedBlockPtrs, m_refLayout, m_initialData.pointers);

			if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
			{
				DE_ASSERT(m_uniformAllocs.size() == bufferSizes.size());
				for (size_t allocNdx = 0; allocNdx < m_uniformAllocs.size(); allocNdx++)
				{
					const int size = bufferSizes[allocNdx];
					vk::Allocation* alloc = m_uniformAllocs[allocNdx].get();
					flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), size);
				}
			}
			else
			{
				DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);
				DE_ASSERT(m_uniformAllocs.size() == 1);
				int totalSize = 0;
				for (size_t bufferNdx = 0; bufferNdx < bufferSizes.size(); bufferNdx++)
				{
					totalSize += bufferSizes[bufferNdx];
				}

				DE_ASSERT(totalSize > 0);
				vk::Allocation* alloc = m_uniformAllocs[0].get();
				flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), totalSize);
			}
		}
	}

	setUpdateBuilder.update(vk, device);

	const vk::VkPipelineLayoutCreateInfo pipelineLayoutParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(vk::VkPipelineLayoutCreateFlags)0,
		1u,													// deUint32						descriptorSetCount;
		&*descriptorSetLayout,								// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	vk::Move<vk::VkPipelineLayout> pipelineLayout(createPipelineLayout(vk, device, &pipelineLayoutParams));

	vk::Move<vk::VkShaderModule> shaderModule (createShaderModule(vk, device, m_context.getBinaryCollection().get("compute"), 0));
	const vk::VkPipelineShaderStageCreateInfo pipelineShaderStageParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		(vk::VkPipelineShaderStageCreateFlags)0,
		vk::VK_SHADER_STAGE_COMPUTE_BIT,						// VkShaderStage				stage;
		*shaderModule,											// VkShader						shader;
		"main",													//
		DE_NULL,												// const VkSpecializationInfo*	pSpecializationInfo;
	};
	const vk::VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		vk::VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0,													// VkPipelineCreateFlags			flags;
		pipelineShaderStageParams,							// VkPipelineShaderStageCreateInfo	stage;
		*pipelineLayout,									// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};
	vk::Move<vk::VkPipeline> pipeline(createComputePipeline(vk, device, DE_NULL, &pipelineCreateInfo));

	vk::Move<vk::VkCommandPool> cmdPool (createCommandPool(vk, device, vk::VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	vk::Move<vk::VkCommandBuffer> cmdBuffer (allocateCommandBuffer(vk, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const vk::VkCommandBufferBeginInfo cmdBufBeginParams =
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//	VkStructureType				sType;
		DE_NULL,											//	const void*					pNext;
		0u,													//	VkCmdBufferOptimizeFlags	flags;
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams));

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, 1, 1, 1);

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	vk::Move<vk::VkFence> fence (createFence(vk, device));

	const vk::VkSubmitInfo  submitInfo  =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const vk::VkSemaphore*)DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1u,
		&cmdBuffer.get(),
		0u,
		(const vk::VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));

	// Read back ac_numPassed data
	bool counterOk;
	{
		const int refCount = 1;
		int resCount = 0;

		resCount = *(const int*)((const deUint8*)acBufferAlloc->getHostPtr());

		counterOk = (refCount == resCount);
		if (!counterOk)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "Error: ac_numPassed = " << resCount << ", expected " << refCount << TestLog::EndMessage;
		}
	}

	// Validate result
	const bool compareOk = compareData(m_context.getTestContext().getLog(), m_refLayout, m_writeData.pointers, m_refLayout, mappedBlockPtrs);

	if (compareOk && counterOk)
		return tcu::TestStatus::pass("Result comparison and counter values are OK");
	else if (!compareOk && counterOk)
		return tcu::TestStatus::fail("Result comparison failed");
	else if (compareOk && !counterOk)
		return tcu::TestStatus::fail("Counter value incorrect");
	else
		return tcu::TestStatus::fail("Result comparison and counter values are incorrect");
}